

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkPowerdown(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
                int fVeryVerbose)

{
  Abc_NtkFunc_t AVar1;
  int *piVar2;
  long *plVar3;
  float Limit;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vProbs;
  void *__ptr;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  Abc_Ntk_t *p;
  Abc_Ntk_t *p_00;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  Abc_Ntk_t *pNtk_00;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint local_6c;
  int local_60;
  
  Limit = (float)Percentage / -100.0 + 0.5;
  iVar12 = 0;
  vProbs = Abc_NtkPowerEstimate(pNtk,0);
  piVar2 = vProbs->pArray;
  if (fVerbose != 0) {
    Abc_NtkPowerPrint(pNtk,vProbs);
  }
  uVar16 = (ulong)pNtk->vObjs->nSize;
  __ptr = calloc(1,uVar16 << 2);
  for (; iVar12 < (int)uVar16; iVar12 = iVar12 + 1) {
    pAVar7 = pNtk;
    pAVar6 = Abc_NtkObj(pNtk,iVar12);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
      iVar5 = pAVar6->Id;
      if (Limit < (float)piVar2[iVar5] || Limit == (float)piVar2[iVar5]) {
        uVar4 = Abc_NtkPowerCriticalEdges(pAVar7,pAVar6,Limit,vProbs);
        *(uint *)((long)__ptr + (long)iVar5 * 4) = uVar4;
      }
    }
    uVar16 = (ulong)(uint)pNtk->vObjs->nSize;
  }
  pAVar7 = Abc_NtkStrash(pNtk,0,1,0);
  p = (Abc_Ntk_t *)Vec_PtrAlloc(0x10);
  p_00 = (Abc_Ntk_t *)Vec_PtrAlloc(0x10);
  local_6c = 0;
  local_60 = 0;
  for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
    pNtk_00 = pNtk;
    pAVar6 = Abc_NtkObj(pNtk,iVar12);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
      uVar4 = (pAVar6->vFanins).nSize;
      uVar16 = 0;
      uVar10 = 0;
      if (0 < (int)uVar4) {
        uVar10 = (ulong)uVar4;
      }
      uVar14 = 0;
      for (; uVar10 != uVar16; uVar16 = uVar16 + 1) {
        pNtk_00 = (Abc_Ntk_t *)(long)(pAVar6->vFanins).pArray[uVar16];
        uVar13 = *(uint *)((long)pAVar6->pNtk->vObjs->pArray[(long)pNtk_00] + 0x14) & 0xf;
        if ((uVar13 != 2) && (uVar13 != 5)) {
          uVar14 = uVar14 + ((*(uint *)((long)__ptr + (long)pAVar6->Id * 4) >> ((uint)uVar16 & 0x1f)
                             & 1) != 0);
        }
      }
      if (fVeryVerbose != 0 || uVar14 != 0) {
        local_6c = local_6c + 1;
        p->ntkFunc = ABC_FUNC_NONE;
        if (uVar14 != 0) {
          for (lVar15 = 0; lVar15 < (int)uVar4; lVar15 = lVar15 + 1) {
            plVar3 = (long *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar15]];
            uVar13 = *(uint *)((long)plVar3 + 0x14) & 0xf;
            if (((uVar13 != 2) && (uVar13 != 5)) &&
               ((*(uint *)((long)__ptr + (long)pAVar6->Id * 4) >> ((uint)lVar15 & 0x1f) & 1) != 0))
            {
              for (lVar17 = 0; lVar17 < *(int *)((long)plVar3 + 0x1c); lVar17 = lVar17 + 1) {
                if ((*(uint *)((long)__ptr + (long)(int)plVar3[2] * 4) >> ((uint)lVar17 & 0x1f) & 1)
                    != 0) {
                  pNtk_00 = p;
                  Vec_PtrPushUnique((Vec_Ptr_t *)p,
                                    *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                              (long)*(int *)(plVar3[4] + lVar17 * 4) * 8));
                }
              }
              uVar4 = (pAVar6->vFanins).nSize;
            }
          }
          AVar1 = p->ntkFunc;
          if ((int)AVar1 <= Degree && AVar1 != ABC_FUNC_NONE) {
            p_00->ntkFunc = ABC_FUNC_NONE;
            for (lVar15 = 0; lVar15 < (int)uVar4; lVar15 = lVar15 + 1) {
              plVar3 = (long *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar15]];
              uVar4 = *(uint *)((long)plVar3 + 0x14) & 0xf;
              if ((uVar4 == 2) || (uVar4 == 5)) {
                pNtk_00 = p_00;
                Vec_PtrPushUnique((Vec_Ptr_t *)p_00,plVar3);
              }
              else {
                for (lVar17 = 0; lVar17 < *(int *)((long)plVar3 + 0x1c); lVar17 = lVar17 + 1) {
                  pNtk_00 = p_00;
                  Vec_PtrPushUnique((Vec_Ptr_t *)p_00,
                                    *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                              (long)*(int *)(plVar3[4] + lVar17 * 4) * 8));
                }
              }
              uVar4 = (pAVar6->vFanins).nSize;
            }
            if (fVeryVerbose != 0) {
              printf("%5d Node %5d : %d %2d %2d  ",(ulong)local_6c,(ulong)(uint)pAVar6->Id,
                     (ulong)uVar14,(ulong)AVar1);
              for (lVar15 = 0; lVar15 < (pAVar6->vFanins).nSize; lVar15 = lVar15 + 1) {
                lVar17 = (long)*(int *)((long)pAVar6->pNtk->vObjs->pArray
                                              [(pAVar6->vFanins).pArray[lVar15]] + 0x10);
                pcVar11 = "*";
                if ((*(uint *)((long)__ptr + (long)pAVar6->Id * 4) >> ((uint)lVar15 & 0x1f) & 1) ==
                    0) {
                  pcVar11 = "";
                }
                printf("%d(%.2f)%s ",(double)(float)piVar2[lVar17],lVar17,pcVar11);
              }
              pNtk_00 = (Abc_Ntk_t *)0xa;
              putchar(10);
            }
            if (1 < (int)AVar1) {
              pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p,0);
              pNtk_00 = p;
              pvVar9 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
              if ((float)piVar2[*(int *)((long)pvVar9 + 0x10)] <=
                  (float)piVar2[*(int *)((long)pvVar8 + 0x10)] &&
                  (float)piVar2[*(int *)((long)pvVar8 + 0x10)] !=
                  (float)piVar2[*(int *)((long)pvVar9 + 0x10)]) {
                Vec_PtrWriteEntry((Vec_Ptr_t *)p,0,pvVar9);
                pNtk_00 = p;
                Vec_PtrWriteEntry((Vec_Ptr_t *)p,1,pvVar8);
              }
              if (AVar1 != ABC_FUNC_BDD) {
                pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
                pvVar9 = Vec_PtrEntry((Vec_Ptr_t *)p,2);
                if ((float)piVar2[*(int *)((long)pvVar9 + 0x10)] <=
                    (float)piVar2[*(int *)((long)pvVar8 + 0x10)] &&
                    (float)piVar2[*(int *)((long)pvVar8 + 0x10)] !=
                    (float)piVar2[*(int *)((long)pvVar9 + 0x10)]) {
                  Vec_PtrWriteEntry((Vec_Ptr_t *)p,1,pvVar9);
                  Vec_PtrWriteEntry((Vec_Ptr_t *)p,2,pvVar8);
                }
                pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p,0);
                pNtk_00 = p;
                pvVar9 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
                if ((float)piVar2[*(int *)((long)pvVar9 + 0x10)] <=
                    (float)piVar2[*(int *)((long)pvVar8 + 0x10)] &&
                    (float)piVar2[*(int *)((long)pvVar8 + 0x10)] !=
                    (float)piVar2[*(int *)((long)pvVar9 + 0x10)]) {
                  Vec_PtrWriteEntry((Vec_Ptr_t *)p,0,pvVar9);
                  pNtk_00 = p;
                  Vec_PtrWriteEntry((Vec_Ptr_t *)p,1,pvVar8);
                }
              }
            }
            local_60 = local_60 + 1;
            Abc_NtkSpeedupNode(pNtk_00,pAVar7,pAVar6,(Vec_Ptr_t *)p_00,(Vec_Ptr_t *)p);
          }
        }
      }
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p);
  Vec_PtrFree((Vec_Ptr_t *)p_00);
  free(__ptr);
  if (fVerbose != 0) {
    printf("Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n",
           (double)local_60 / (double)(int)local_6c,(ulong)(uint)pNtk->nObjCounts[7]);
  }
  for (iVar12 = 0; iVar12 < pAVar7->vObjs->nSize; iVar12 = iVar12 + 1) {
    pAVar6 = Abc_NtkObj(pAVar7,iVar12);
    if (pAVar6 != (Abc_Obj_t *)0x0) {
      iVar5 = Abc_AigNodeIsAnd(pAVar6);
      if (((iVar5 != 0) && ((pAVar6->field_5).pData != (void *)0x0)) &&
         (0 < *(int *)((long)(pAVar6->field_5).pData + 0x2c))) {
        (pAVar6->field_5).pData = (void *)0x0;
      }
    }
  }
  Vec_IntFree(vProbs);
  return pAVar7;
}

Assistant:

Abc_Ntk_t * Abc_NtkPowerdown( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vProbs;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float * pProb, Limit;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puPCEdges;
    // compute the limit
    Limit = 0.5 - (1.0 * Percentage / 100);
    // perform computation of switching probability
    vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
    pProb = (float *)vProbs->pArray;
    // compute percentage of wires of each type
    if ( fVerbose )
        Abc_NtkPowerPrint( pNtk, vProbs );
    // mark the power critical nodes and edges
    puPCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puPCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pProb[pNode->Id] < Limit )
            continue;
        puPCEdges[pNode->Id] = Abc_NtkPowerCriticalEdges( pNtk, pNode, Limit, vProbs );
    }
/*
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Counter += Abc_ObjFaninNum(pNode);
            CounterRes += Extra_WordCountOnes( puPCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Counter, CounterRes, 1.0*CounterRes/Counter );
    }
*/
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( pProb[pNode->Id] < Limit )
//            continue;
        // count the number of non-PI power-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of power-critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puPCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, pProb[pFanin->Id], (puPCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puPCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    Vec_IntFree( vProbs );
    return pNtkNew;
}